

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O3

void __thiscall
Assimp::AssbinExport::WriteBinaryMesh(AssbinExport *this,IOStream *container,aiMesh *mesh)

{
  uint uVar1;
  uint uVar2;
  uint n;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  aiColor4t<float> *in;
  aiFace *paVar8;
  uint n_2;
  uint uVar9;
  aiVector3t<float> *paVar10;
  aiVector3D *paVar11;
  bool bVar12;
  uint32_t t;
  AssbinChunkWriter chunk;
  uint local_74;
  AssbinExport *local_70;
  AssbinChunkWriter local_68;
  
  local_68.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_0080c0c8;
  local_68.buffer = (uint8_t *)0x0;
  local_68.magic = 0x1237;
  local_68.cur_size = 0;
  local_68.cursor = 0;
  local_68.initial = 0x1000;
  uVar5 = mesh->mPrimitiveTypes;
  local_70 = this;
  local_68.container = container;
  AssbinChunkWriter::Grow(&local_68,4);
  *(uint *)(local_68.buffer + local_68.cursor) = uVar5;
  local_68.cursor = local_68.cursor + 4;
  local_74 = mesh->mNumVertices;
  (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,4,1);
  local_74 = mesh->mNumFaces;
  (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,4,1);
  local_74 = mesh->mNumBones;
  (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,4,1);
  local_74 = mesh->mMaterialIndex;
  (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,4,1);
  bVar12 = mesh->mVertices != (aiVector3D *)0x0;
  uVar5 = bVar12 + 2;
  if (mesh->mNormals == (aiVector3D *)0x0) {
    uVar5 = (uint)bVar12;
  }
  local_74 = uVar5;
  if ((mesh->mTangents != (aiVector3D *)0x0) &&
     (local_74 = uVar5 + 4, mesh->mBitangents == (aiVector3D *)0x0)) {
    local_74 = uVar5;
  }
  lVar3 = 0;
  do {
    if (mesh->mTextureCoords[lVar3] == (aiVector3D *)0x0) break;
    local_74 = local_74 | 0x100 << ((byte)lVar3 & 0x1f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 0;
  do {
    if (mesh->mColors[lVar3] == (aiColor4D *)0x0) break;
    local_74 = local_74 | 0x10000 << ((byte)lVar3 & 0x1f);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,4,1);
  paVar10 = mesh->mVertices;
  if (paVar10 != (aiVector3t<float> *)0x0) {
    uVar4 = (ulong)mesh->mNumVertices;
    if (local_70->shortened == true) {
      WriteBounds<aiVector3t<float>>(&local_68.super_IOStream,paVar10,mesh->mNumVertices);
    }
    else if (uVar4 != 0) {
      do {
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,paVar10,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar10->y,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar10->z,4,1);
        paVar10 = paVar10 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  paVar10 = mesh->mNormals;
  if (paVar10 != (aiVector3t<float> *)0x0) {
    uVar4 = (ulong)mesh->mNumVertices;
    if (local_70->shortened == true) {
      WriteBounds<aiVector3t<float>>(&local_68.super_IOStream,paVar10,mesh->mNumVertices);
    }
    else if (uVar4 != 0) {
      do {
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,paVar10,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar10->y,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar10->z,4,1);
        paVar10 = paVar10 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  paVar10 = mesh->mTangents;
  if ((paVar10 != (aiVector3t<float> *)0x0) && (mesh->mBitangents != (aiVector3D *)0x0)) {
    uVar4 = (ulong)mesh->mNumVertices;
    if (local_70->shortened == true) {
      WriteBounds<aiVector3t<float>>(&local_68.super_IOStream,paVar10,mesh->mNumVertices);
      WriteBounds<aiVector3t<float>>(&local_68.super_IOStream,mesh->mBitangents,mesh->mNumVertices);
    }
    else if (uVar4 != 0) {
      do {
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,paVar10,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar10->y,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar10->z,4,1);
        paVar10 = paVar10 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      uVar4 = (ulong)mesh->mNumVertices;
      if (uVar4 != 0) {
        paVar11 = mesh->mBitangents;
        do {
          (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,paVar11,4,1);
          (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar11->y,4,1);
          (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar11->z,4,1);
          paVar11 = paVar11 + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
    }
  }
  lVar3 = 0;
  do {
    in = mesh->mColors[lVar3];
    if (in == (aiColor4t<float> *)0x0) break;
    uVar4 = (ulong)mesh->mNumVertices;
    if (local_70->shortened == true) {
      WriteBounds<aiColor4t<float>>(&local_68.super_IOStream,in,mesh->mNumVertices);
    }
    else {
      for (; uVar4 != 0; uVar4 = uVar4 - 1) {
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,in,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&in->g,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&in->b,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&in->a,4,1);
        in = in + 1;
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  lVar3 = 0;
  do {
    if (mesh->mTextureCoords[lVar3] == (aiVector3D *)0x0) break;
    local_74 = mesh->mNumUVComponents[lVar3];
    (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,4,1);
    paVar10 = mesh->mTextureCoords[lVar3];
    uVar4 = (ulong)mesh->mNumVertices;
    if (local_70->shortened == true) {
      WriteBounds<aiVector3t<float>>(&local_68.super_IOStream,paVar10,mesh->mNumVertices);
    }
    else {
      for (; uVar4 != 0; uVar4 = uVar4 - 1) {
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,paVar10,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar10->y,4,1);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&paVar10->z,4,1);
        paVar10 = paVar10 + 1;
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  uVar5 = mesh->mNumFaces;
  if (local_70->shortened == false) {
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        paVar8 = mesh->mFaces;
        local_74 = CONCAT22(local_74._2_2_,(short)paVar8[uVar4].mNumIndices);
        (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,2,1);
        paVar8 = paVar8 + uVar4;
        if (paVar8->mNumIndices != 0) {
          uVar7 = 0;
          do {
            if (mesh->mNumVertices < 0x10000) {
              local_74 = CONCAT22(local_74._2_2_,(short)paVar8->mIndices[uVar7]);
              (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,2,1);
            }
            else {
              local_74 = paVar8->mIndices[uVar7];
              (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,4,1);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < paVar8->mNumIndices);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < mesh->mNumFaces);
    }
  }
  else if (uVar5 != 0) {
    if (0x1ff < uVar5) {
      uVar5 = 0x200;
    }
    uVar9 = 0;
    do {
      local_74 = 0;
      if (uVar5 != 0) {
        uVar4 = 0;
        local_74 = 0;
        do {
          uVar6 = uVar9 + (int)uVar4;
          uVar1 = mesh->mFaces[uVar6].mNumIndices;
          local_74 = (uVar1 & 0xffff) + local_74;
          local_74 = local_74 * 0x10000 ^ uVar1 >> 5 & 0x7fff800 ^ local_74;
          local_74 = (local_74 >> 0xb) + local_74;
          local_74 = local_74 * 8 ^ local_74;
          local_74 = (local_74 >> 5) + local_74;
          local_74 = local_74 * 0x10 ^ local_74;
          local_74 = (local_74 >> 0x11) + local_74;
          local_74 = local_74 * 0x2000000 ^ local_74;
          local_74 = (local_74 >> 6) + local_74;
          if ((ulong)uVar1 != 0) {
            uVar7 = 0;
            do {
              uVar2 = mesh->mFaces[uVar6].mIndices[uVar7];
              local_74 = (uVar2 & 0xffff) + local_74;
              local_74 = local_74 * 0x10000 ^ uVar2 >> 5 & 0x7fff800 ^ local_74;
              local_74 = (local_74 >> 0xb) + local_74;
              local_74 = local_74 * 8 ^ local_74;
              local_74 = (local_74 >> 5) + local_74;
              local_74 = local_74 * 0x10 ^ local_74;
              local_74 = (local_74 >> 0x11) + local_74;
              local_74 = local_74 * 0x2000000 ^ local_74;
              local_74 = (local_74 >> 6) + local_74;
              uVar7 = uVar7 + 1;
            } while (uVar1 != uVar7);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != uVar5);
      }
      (*local_68.super_IOStream._vptr_IOStream[3])(&local_68,&local_74,4,1);
      uVar9 = uVar9 + uVar5;
      uVar5 = mesh->mNumFaces - uVar9;
      if (0x1ff < uVar5) {
        uVar5 = 0x200;
      }
    } while (mesh->mNumFaces != uVar9);
  }
  if (mesh->mNumBones != 0) {
    uVar4 = 0;
    do {
      WriteBinaryBone(local_70,&local_68.super_IOStream,mesh->mBones[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < mesh->mNumBones);
  }
  AssbinChunkWriter::~AssbinChunkWriter(&local_68);
  return;
}

Assistant:

void WriteBinaryMesh(IOStream * container, const aiMesh* mesh)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AIMESH );

        Write<unsigned int>(&chunk,mesh->mPrimitiveTypes);
        Write<unsigned int>(&chunk,mesh->mNumVertices);
        Write<unsigned int>(&chunk,mesh->mNumFaces);
        Write<unsigned int>(&chunk,mesh->mNumBones);
        Write<unsigned int>(&chunk,mesh->mMaterialIndex);

        // first of all, write bits for all existent vertex components
        unsigned int c = 0;
        if (mesh->mVertices) {
            c |= ASSBIN_MESH_HAS_POSITIONS;
        }
        if (mesh->mNormals) {
            c |= ASSBIN_MESH_HAS_NORMALS;
        }
        if (mesh->mTangents && mesh->mBitangents) {
            c |= ASSBIN_MESH_HAS_TANGENTS_AND_BITANGENTS;
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (!mesh->mTextureCoords[n]) {
                break;
            }
            c |= ASSBIN_MESH_HAS_TEXCOORD(n);
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
            if (!mesh->mColors[n]) {
                break;
            }
            c |= ASSBIN_MESH_HAS_COLOR(n);
        }
        Write<unsigned int>(&chunk,c);

        aiVector3D minVec, maxVec;
        if (mesh->mVertices) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mVertices,mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mVertices,mesh->mNumVertices);
        }
        if (mesh->mNormals) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mNormals,mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mNormals,mesh->mNumVertices);
        }
        if (mesh->mTangents && mesh->mBitangents) {
            if (shortened) {
                WriteBounds(&chunk,mesh->mTangents,mesh->mNumVertices);
                WriteBounds(&chunk,mesh->mBitangents,mesh->mNumVertices);
            } // else write as usual
            else {
                WriteArray<aiVector3D>(&chunk,mesh->mTangents,mesh->mNumVertices);
                WriteArray<aiVector3D>(&chunk,mesh->mBitangents,mesh->mNumVertices);
            }
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_COLOR_SETS;++n) {
            if (!mesh->mColors[n])
                break;

            if (shortened) {
                WriteBounds(&chunk,mesh->mColors[n],mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiColor4D>(&chunk,mesh->mColors[n],mesh->mNumVertices);
        }
        for (unsigned int n = 0; n < AI_MAX_NUMBER_OF_TEXTURECOORDS;++n) {
            if (!mesh->mTextureCoords[n])
                break;

            // write number of UV components
            Write<unsigned int>(&chunk,mesh->mNumUVComponents[n]);

            if (shortened) {
                WriteBounds(&chunk,mesh->mTextureCoords[n],mesh->mNumVertices);
            } // else write as usual
            else WriteArray<aiVector3D>(&chunk,mesh->mTextureCoords[n],mesh->mNumVertices);
        }

        // write faces. There are no floating-point calculations involved
        // in these, so we can write a simple hash over the face data
        // to the dump file. We generate a single 32 Bit hash for 512 faces
        // using Assimp's standard hashing function.
        if (shortened) {
            unsigned int processed = 0;
            for (unsigned int job;(job = std::min(mesh->mNumFaces-processed,512u));processed += job) {

                uint32_t hash = 0;
                for (unsigned int a = 0; a < job;++a) {

                    const aiFace& f = mesh->mFaces[processed+a];
                    uint32_t tmp = f.mNumIndices;
                    hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
                    for (unsigned int i = 0; i < f.mNumIndices; ++i) {
                        static_assert(AI_MAX_VERTICES <= 0xffffffff, "AI_MAX_VERTICES <= 0xffffffff");
                        tmp = static_cast<uint32_t>( f.mIndices[i] );
                        hash = SuperFastHash(reinterpret_cast<const char*>(&tmp),sizeof tmp,hash);
                    }
                }
                Write<unsigned int>(&chunk,hash);
            }
        }
        else // else write as usual
        {
            // if there are less than 2^16 vertices, we can simply use 16 bit integers ...
            for (unsigned int i = 0; i < mesh->mNumFaces;++i) {
                const aiFace& f = mesh->mFaces[i];

                static_assert(AI_MAX_FACE_INDICES <= 0xffff, "AI_MAX_FACE_INDICES <= 0xffff");
                Write<uint16_t>(&chunk,f.mNumIndices);

                for (unsigned int a = 0; a < f.mNumIndices;++a) {
                    if (mesh->mNumVertices < (1u<<16)) {
                        Write<uint16_t>(&chunk,f.mIndices[a]);
                    }
                    else Write<unsigned int>(&chunk,f.mIndices[a]);
                }
            }
        }

        // write bones
        if (mesh->mNumBones) {
            for (unsigned int a = 0; a < mesh->mNumBones;++a) {
                const aiBone* b = mesh->mBones[a];
                WriteBinaryBone(&chunk,b);
            }
        }
    }